

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.hpp
# Opt level: O3

Result __thiscall
Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::RationalConstantType>>
          (LAKBO *this,MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *t0,
          MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *t1)

{
  anon_class_8_1_54a39818_for__func aVar1;
  Result RVar2;
  long lVar3;
  int iVar4;
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>_>
  local_1d0;
  anon_class_72_1_a86c6e30_for__func local_188;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::PolyNf,_Kernel::PolyNf>_>_>
  local_140;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::PolyNf,_Kernel::PolyNf>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:101:16),_Kernel::Ordering::Result>_>
  local_b0;
  
  aVar1.x = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)(t0->_factors)._stack;
  lVar3 = (long)(t0->_factors)._cursor - (long)aVar1.x;
  if (lVar3 == 0) {
    iVar4 = 0;
  }
  else {
    local_1d0._iter._current.
    super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
    ._elem._elem.init._iter._inner._to = (aVar1.x)->power;
    local_1d0._iter._current.
    super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
    ._elem._elem._8_8_ = 0;
    local_1d0._iter._current.
    super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
    ._elem._elem._20_4_ = 0;
    iVar4 = (int)CONCAT71((uint7)(uint3)((uint)local_1d0._iter._current.
                                               super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
                                               ._elem._elem.init._iter._inner._to >> 8),1);
    local_1d0._iter._current.
    super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
    ._elem._elem.init._iter._func.x = (anon_class_8_1_54a39818_for__func)aVar1.x;
  }
  local_1d0._iter._master._inner._inner._next = (unsigned_long)(lVar3 != 0);
  local_1d0._iter._master._inner._inner._to = (lVar3 >> 2) * 0x6db6db6db6db6db7;
  local_1d0._iter._master._inner._inner._from = 0;
  local_1d0._iter._current.
  super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
  ._isSome = SUB41(iVar4,0);
  aVar1.x = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)(t1->_factors)._stack;
  lVar3 = (long)(t1->_factors)._cursor - (long)aVar1.x;
  local_188.other._iter._current.
  super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
  ._isSome = lVar3 != 0;
  if (local_188.other._iter._current.
      super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
      ._isSome) {
    iVar4 = (aVar1.x)->power;
  }
  local_188.other._iter._master._inner._inner._next =
       (unsigned_long)
       local_188.other._iter._current.
       super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
       ._isSome;
  local_188.other._iter._master._inner._inner._to = (lVar3 >> 2) * 0x6db6db6db6db6db7;
  local_188.other._iter._master._inner._inner._from = 0;
  if (local_188.other._iter._current.
      super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
      ._isSome) {
    local_188.other._iter._current.
    super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
    ._elem._elem._8_8_ = 0;
    local_188.other._iter._current.
    super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
    ._elem._elem._20_4_ = 0;
    local_188.other._iter._current.
    super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
    ._elem._elem.init._iter._func.x = (anon_class_8_1_54a39818_for__func)aVar1.x;
    local_188.other._iter._current.
    super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
    ._elem._elem.init._iter._inner._to = iVar4;
  }
  local_1d0._iter._master._inner._func.a =
       (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)t0;
  local_188.other._iter._master._inner._func.a =
       (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)t1;
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/Ordering.hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/Ordering.hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>_>
  ::
  map<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16)>
            (&local_140,&local_1d0,&local_188);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>const&>,Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&,Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&)const::{lambda(Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&)#1}::operator()(Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&)const::{lambda(auto:1&)#1},Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel:...l::PolyNf_const&>>>>>)::{lambda(Kernel::PolyNf_const&)#1},std::pair<Kernel::PolyNf,Kernel::PolyNf>>>
  ::
  map<Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&,Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>const&)const::_lambda(auto:1)_1_>
            (&local_b0,&local_140,(anon_class_8_1_8991fb9c_for__func)this);
  RVar2 = AlascaOrderingUtils::
          lexIter<Lib::IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::PolyNf,_Kernel::PolyNf>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:101:16),_Kernel::Ordering::Result>_>_>
                    (&local_b0);
  return RVar2;
}

Assistant:

Ordering::Result cmpSameSkeleton(MonomFactors<NumTraits> const& t0, MonomFactors<NumTraits> const& t1) const 
  { 
    auto iterFlat = [](MonomFactors<NumTraits> const& m) {
      return m.iter()
        .flatMap([](auto& x) { return 
            range(0, x.power)
              .map([&](auto) -> auto& { return x.term; }); });
    };
    return AlascaOrderingUtils::lexIter(
        iterFlat(t0).zip(iterFlat(t1))
          .map([&](auto pair) { return cmpSameSkeleton(pair.first, pair.second); })
        );
  }